

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O1

bool __thiscall r_exec::HLPBindingMap::need_binding(HLPBindingMap *this,Code *pattern)

{
  bool bVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ushort uVar5;
  bool bVar6;
  Atom p_atom;
  undefined4 local_2c;
  
  bVar6 = false;
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar3 = r_code::Atom::asOpcode();
  if (sVar3 != Opcodes::Ont) {
    bVar6 = false;
    (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 != Opcodes::Ent) {
      bVar6 = false;
      (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
      sVar3 = r_code::Atom::asOpcode();
      if (sVar3 != Opcodes::Mdl) {
        bVar6 = false;
        (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
        sVar3 = r_code::Atom::asOpcode();
        if (sVar3 != Opcodes::Cst) {
          iVar4 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
          bVar6 = (short)iVar4 != 0;
          if (bVar6) {
            iVar4 = (*(pattern->super__Object)._vptr__Object[9])(pattern,0);
            bVar1 = need_binding(this,(Code *)CONCAT44(extraout_var,iVar4));
            if (!bVar1) {
              uVar5 = 1;
              do {
                iVar4 = (*(pattern->super__Object)._vptr__Object[10])(pattern);
                bVar6 = uVar5 < (ushort)iVar4;
                if (!bVar6) goto LAB_0015ab97;
                iVar4 = (*(pattern->super__Object)._vptr__Object[9])(pattern,(ulong)uVar5);
                bVar1 = need_binding(this,(Code *)CONCAT44(extraout_var_00,iVar4));
                uVar5 = uVar5 + 1;
              } while (!bVar1);
            }
            if (bVar6) {
              return true;
            }
          }
LAB_0015ab97:
          iVar4 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
          bVar6 = 1 < (ushort)iVar4;
          if (bVar6) {
            uVar5 = 1;
            do {
              iVar4 = (*(pattern->super__Object)._vptr__Object[4])(pattern,(ulong)uVar5);
              local_2c = *(undefined4 *)CONCAT44(extraout_var_01,iVar4);
              bVar2 = r_code::Atom::getDescriptor();
              if (bVar2 - 0xc6 < 2) {
                bVar2 = r_code::Atom::getAtomCount();
                uVar5 = uVar5 + bVar2;
LAB_0015abf9:
                bVar1 = true;
              }
              else {
                if (bVar2 != 0x86) goto LAB_0015abf9;
                bVar1 = false;
              }
              r_code::Atom::~Atom((Atom *)&local_2c);
              if (!bVar1) {
                return bVar6;
              }
              uVar5 = uVar5 + 1;
              iVar4 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
              bVar6 = uVar5 < (ushort)iVar4;
            } while (bVar6);
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool HLPBindingMap::need_binding(Code *pattern) const
{
    if (pattern->code(0).asOpcode() == Opcodes::Ont ||
        pattern->code(0).asOpcode() == Opcodes::Ent ||
        pattern->code(0).asOpcode() == Opcodes::Mdl ||
        pattern->code(0).asOpcode() == Opcodes::Cst) {
        return false;
    }

    for (uint16_t i = 0; i < pattern->references_size(); ++i) {
        if (need_binding(pattern->get_reference(i))) {
            return true;
        }
    }

    for (uint16_t i = 1; i < pattern->code_size(); ++i) {
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            return true;

        case Atom::TIMESTAMP:
        case Atom::STRING:
            i += p_atom.getAtomCount();
            break;

        default:
            break;
        }
    }

    return false;
}